

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiColumnTotalSize(Fts5Context *pCtx,int iCol,sqlite3_int64 *pnToken)

{
  int iVar1;
  Fts5FullTable *pTab;
  Fts5Cursor *pCsr;
  sqlite3_int64 *pnToken_local;
  int iCol_local;
  Fts5Context *pCtx_local;
  
  iVar1 = sqlite3Fts5StorageSize(*(Fts5Storage **)(*(long *)pCtx + 0x28),iCol,pnToken);
  return iVar1;
}

Assistant:

static int fts5ApiColumnTotalSize(
  Fts5Context *pCtx, 
  int iCol, 
  sqlite3_int64 *pnToken
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  return sqlite3Fts5StorageSize(pTab->pStorage, iCol, pnToken);
}